

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

IStreamingReporterPtr __thiscall
Catch::ListenerRegistrar<Catch2ApprovalListener>::ListenerFactory::create
          (ListenerFactory *this,ReporterConfig *config)

{
  LazyStat<Catch::TestRunInfo> *pLVar1;
  StreamingReporterBase<Catch::TestEventListenerBase> *this_00;
  ReporterConfig *in_RDX;
  
  this_00 = (StreamingReporterBase<Catch::TestEventListenerBase> *)operator_new(0x1c0);
  StreamingReporterBase<Catch::TestEventListenerBase>::StreamingReporterBase(this_00,in_RDX);
  (this_00->super_IStreamingReporter)._vptr_IStreamingReporter =
       (_func_int **)&PTR__Catch2ApprovalListener_001a1560;
  this_00[1].super_IStreamingReporter._vptr_IStreamingReporter = (_func_int **)0x0;
  this_00[1].m_config.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this_00[1].m_config.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00[1].stream =
       (ostream *)this_00[1].currentTestRunInfo.super_Option<Catch::TestRunInfo>.storage;
  this_00[1].currentTestRunInfo.super_Option<Catch::TestRunInfo>.nullableValue = (TestRunInfo *)0x0;
  this_00[1].currentTestRunInfo.super_Option<Catch::TestRunInfo>.storage[0] = '\0';
  *(bool **)(this_00[1].currentTestRunInfo.super_Option<Catch::TestRunInfo>.storage + 0x10) =
       &this_00[1].currentTestRunInfo.used;
  pLVar1 = &this_00[1].currentTestRunInfo;
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0x18] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0x19] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0x1a] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0x1b] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0x1c] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0x1d] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0x1e] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0x1f] = '\0';
  this_00[1].currentTestRunInfo.used = false;
  (this->super_IReporterFactory)._vptr_IReporterFactory = (_func_int **)this_00;
  return (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
          )(__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
            )this;
}

Assistant:

IStreamingReporterPtr create( ReporterConfig const& config ) const override {
                return std::unique_ptr<T>( new T( config ) );
            }